

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_double_&,_const_double_&> * __thiscall
Catch::ExprLhs<double_const&>::operator>=(ExprLhs<const_double_&> *this,double *rhs)

{
  double *in_RDX;
  undefined8 *in_RSI;
  BinaryExpr<const_double_&,_const_double_&> *in_RDI;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  char *rawChars;
  BinaryExpr<const_double_&,_const_double_&> *this_00;
  StringRef in_stack_ffffffffffffffd8;
  
  uVar1 = *in_RDX <= *(double *)*in_RSI;
  rawChars = (char *)*in_RSI;
  this_00 = in_RDI;
  StringRef::StringRef((StringRef *)in_RDI,rawChars);
  BinaryExpr<const_double_&,_const_double_&>::BinaryExpr
            (this_00,SUB81((ulong)rawChars >> 0x38,0),(double *)in_RDI,in_stack_ffffffffffffffd8,
             (double *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  return this_00;
}

Assistant:

auto operator >= ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs >= rhs), m_lhs, ">=", rhs };
        }